

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
::dx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Fad<double> *pFVar7;
  FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar8;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar9;
  double *pdVar10;
  value_type vVar11;
  double dVar12;
  
  pFVar7 = (this->left_->fadexpr_).right_;
  pdVar10 = &pFVar7->defaultVal;
  if ((pFVar7->dx_).num_elts != 0) {
    pdVar10 = (pFVar7->dx_).ptr_to_data + i;
  }
  this_00 = &this->right_->fadexpr_;
  dVar1 = *pdVar10;
  dVar2 = (this->left_->fadexpr_).left_.constant_;
  dVar3 = (this_00->left_->fadexpr_).left_.constant_;
  dVar4 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar5 = (this_00->right_->fadexpr_).left_.constant_;
  dVar6 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar11 = FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
           ::dx(this_00,i);
  pFVar8 = (this->right_->fadexpr_).left_;
  pFVar9 = (this->right_->fadexpr_).right_;
  dVar12 = ((pFVar9->fadexpr_).left_.constant_ - ((pFVar9->fadexpr_).right_)->val_) *
           ((pFVar8->fadexpr_).left_.constant_ - ((pFVar8->fadexpr_).right_)->val_);
  return ((dVar5 - dVar6) * (dVar3 - dVar4) * dVar1 * dVar2 -
         (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ * vVar11)
         / (dVar12 * dVar12);
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}